

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CycleBreakingAbstract.h
# Opt level: O0

bool __thiscall
covenant::CycleBreaking<covenant::Sym>::isRLRule
          (CycleBreaking<covenant::Sym> *this,CFG *g,uint lhs,
          vector<covenant::Sym,_std::allocator<covenant::Sym>_> *rhs,
          set<int,_std::less<int>,_std::allocator<int>_> *scc)

{
  const_iterator End;
  bool bVar1;
  Sym p;
  size_type sVar2;
  const_reference this_00;
  set<int,_std::less<int>,_std::allocator<int>_> *in_RCX;
  int in_EDX;
  const_iterator in_RDI;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> *in_stack_ffffffffffffff88;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_ffffffffffffff90;
  set<int,_std::less<int>,_std::allocator<int>_> *NonTerminals;
  CycleBreaking<covenant::Sym> *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  undefined1 local_1;
  
  bVar1 = std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::empty
                    ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                     CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  if (bVar1) {
    local_1 = true;
  }
  else {
    std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::begin(in_stack_ffffffffffffff88);
    std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::end(in_stack_ffffffffffffff88);
    __gnu_cxx::
    __normal_iterator<const_covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
    ::operator-((__normal_iterator<const_covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
                 *)in_stack_ffffffffffffff98,(difference_type)in_stack_ffffffffffffff90);
    End._M_current._7_1_ = in_stack_ffffffffffffffa7;
    End._M_current._0_7_ = in_stack_ffffffffffffffa0;
    bVar1 = allTerminal(in_stack_ffffffffffffff98,in_RDI,End,in_stack_ffffffffffffff90);
    if (bVar1) {
      NonTerminals = in_RCX;
      sVar2 = std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::size
                        ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)in_RCX);
      this_00 = std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::operator[]
                          ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)NonTerminals,
                           sVar2 - 1);
      p = Sym::mkVar(in_EDX);
      bVar1 = Sym::operator==(this_00,p);
      local_1 = true;
      if (!bVar1) {
        sVar2 = std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::size
                          ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)in_RCX);
        std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::operator[]
                  ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)in_RCX,sVar2 - 1);
        local_1 = isTerminal((CycleBreaking<covenant::Sym> *)
                             CONCAT17(local_1,in_stack_ffffffffffffffa0),this_00,NonTerminals);
      }
    }
    else {
      local_1 = false;
    }
  }
  return (bool)local_1;
}

Assistant:

bool isRLRule (const CFG &g, unsigned int lhs, const vector<EdgeSym> &rhs, 
                 const set<int> &scc)
  {
    if (rhs.empty()) 
      return true;
      
    if (allTerminal(rhs.begin(), rhs.end()-1, scc))
    {
      return ((rhs[rhs.size()-1] == EdgeSym::mkVar(lhs)) || 
              isTerminal(rhs[rhs.size()-1],scc));
    }
    else
      return false;
  }